

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O3

void run_container_intersection(run_container_t *src_1,run_container_t *src_2,run_container_t *dst)

{
  int iVar1;
  rle16_t *prVar2;
  rle16_t *prVar3;
  rle16_t *prVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  bool bVar16;
  
  prVar3 = src_1->runs;
  bVar15 = false;
  if ((src_1->n_runs == 1) && (bVar15 = false, prVar3->value == 0)) {
    bVar15 = prVar3->length == 0xffff;
  }
  prVar4 = src_2->runs;
  bVar16 = false;
  if ((src_2->n_runs == 1) && (prVar4->value == 0)) {
    bVar16 = prVar4->length == 0xffff;
  }
  if ((bool)(bVar16 | bVar15)) {
    if (bVar15) {
      src_1 = src_2;
    }
    run_container_copy(src_1,dst);
    return;
  }
  iVar6 = src_2->n_runs + src_1->n_runs;
  if (dst->capacity < iVar6) {
    run_container_grow(dst,iVar6,false);
    prVar3 = src_1->runs;
    prVar4 = src_2->runs;
  }
  dst->n_runs = 0;
  iVar6 = src_1->n_runs;
  if (0 < iVar6) {
    uVar5 = (uint)prVar4->value;
    uVar11 = (uint)prVar4->value + (uint)prVar4->length + 1;
    uVar8 = (uint)prVar3->value;
    uVar13 = (uint)prVar3->value + (uint)prVar3->length + 1;
    iVar7 = 0;
    iVar9 = 0;
    iVar10 = 0;
    do {
      iVar1 = src_2->n_runs;
      if (iVar1 <= iVar9) {
        return;
      }
      if (uVar5 < uVar13) {
        if (uVar8 < uVar11) {
          uVar14 = uVar5;
          if (uVar5 < uVar8) {
            uVar14 = uVar8;
          }
          uVar12 = uVar11;
          if (uVar13 == uVar11) {
            iVar10 = iVar10 + 1;
            uVar13 = uVar11;
            if (iVar10 < iVar6) {
              uVar8 = (uint)prVar3[iVar10].value;
              uVar13 = uVar8 + prVar3[iVar10].length + 1;
            }
            iVar6 = iVar9 + 1;
            if (iVar6 < iVar1) {
              uVar5 = (uint)prVar4[iVar6].value;
              iVar9 = iVar6;
              uVar11 = uVar5 + prVar4[iVar6].length + 1;
            }
            else {
LAB_0011dfb7:
              iVar9 = iVar9 + 1;
            }
          }
          else if (uVar13 < uVar11) {
            iVar10 = iVar10 + 1;
            uVar12 = uVar13;
            if (iVar10 < iVar6) {
              uVar8 = (uint)prVar3[iVar10].value;
              uVar13 = uVar8 + prVar3[iVar10].length + 1;
            }
          }
          else {
            iVar6 = iVar9 + 1;
            if (iVar1 <= iVar6) goto LAB_0011dfb7;
            uVar5 = (uint)prVar4[iVar6].value;
            iVar9 = iVar6;
            uVar11 = prVar4[iVar6].length + uVar5 + 1;
          }
          prVar2 = dst->runs;
          prVar2[iVar7].value = (ushort)uVar14;
          prVar2[iVar7].length = ~(ushort)uVar14 + (short)uVar12;
          iVar7 = iVar7 + 1;
          dst->n_runs = iVar7;
          iVar6 = src_1->n_runs;
        }
        else {
          iVar9 = iVar9 + 1;
          if (iVar9 < iVar1) {
            uVar5 = (uint)prVar4[iVar9].value;
            uVar11 = prVar4[iVar9].length + uVar5 + 1;
          }
        }
      }
      else {
        iVar10 = iVar10 + 1;
        if (iVar10 < iVar6) {
          uVar8 = (uint)prVar3[iVar10].value;
          uVar13 = prVar3[iVar10].length + uVar8 + 1;
        }
      }
    } while (iVar10 < iVar6);
  }
  return;
}

Assistant:

void run_container_intersection(const run_container_t *src_1,
                                const run_container_t *src_2,
                                run_container_t *dst) {
    const bool if1 = run_container_is_full(src_1);
    const bool if2 = run_container_is_full(src_2);
    if (if1 || if2) {
        if (if1) {
            run_container_copy(src_2, dst);
            return;
        }
        if (if2) {
            run_container_copy(src_1, dst);
            return;
        }
    }
    // TODO: this could be a lot more efficient, could use SIMD optimizations
    const int32_t neededcapacity = src_1->n_runs + src_2->n_runs;
    if (dst->capacity < neededcapacity)
        run_container_grow(dst, neededcapacity, false);
    dst->n_runs = 0;
    int32_t rlepos = 0;
    int32_t xrlepos = 0;
    int32_t start = src_1->runs[rlepos].value;
    int32_t end = start + src_1->runs[rlepos].length + 1;
    int32_t xstart = src_2->runs[xrlepos].value;
    int32_t xend = xstart + src_2->runs[xrlepos].length + 1;
    while ((rlepos < src_1->n_runs) && (xrlepos < src_2->n_runs)) {
        if (end <= xstart) {
            ++rlepos;
            if (rlepos < src_1->n_runs) {
                start = src_1->runs[rlepos].value;
                end = start + src_1->runs[rlepos].length + 1;
            }
        } else if (xend <= start) {
            ++xrlepos;
            if (xrlepos < src_2->n_runs) {
                xstart = src_2->runs[xrlepos].value;
                xend = xstart + src_2->runs[xrlepos].length + 1;
            }
        } else {  // they overlap
            const int32_t lateststart = start > xstart ? start : xstart;
            int32_t earliestend;
            if (end == xend) {  // improbable
                earliestend = end;
                rlepos++;
                xrlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }
                if (xrlepos < src_2->n_runs) {
                    xstart = src_2->runs[xrlepos].value;
                    xend = xstart + src_2->runs[xrlepos].length + 1;
                }
            } else if (end < xend) {
                earliestend = end;
                rlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }

            } else {  // end > xend
                earliestend = xend;
                xrlepos++;
                if (xrlepos < src_2->n_runs) {
                    xstart = src_2->runs[xrlepos].value;
                    xend = xstart + src_2->runs[xrlepos].length + 1;
                }
            }
            dst->runs[dst->n_runs].value = (uint16_t)lateststart;
            dst->runs[dst->n_runs].length =
                (uint16_t)(earliestend - lateststart - 1);
            dst->n_runs++;
        }
    }
}